

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedteximage3d_max_width_height_depth
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_39;
  string local_38;
  int local_14;
  NegativeTestContext *pNStack_10;
  int maxTextureSize;
  NegativeTestContext *ctx_local;
  
  pNStack_10 = ctx;
  local_14 = NegativeTestContext::getInteger(ctx,0xd33);
  this = pNStack_10;
  local_14 = local_14 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if width, height or depth is greater than GL_MAX_TEXTURE_SIZE."
             ,&local_39);
  NegativeTestContext::beginSection(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&pNStack_10->super_CallLogWrapper,0x8c1a,0,0x9278,local_14,0,0,0,0,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&pNStack_10->super_CallLogWrapper,0x8c1a,0,0x9278,0,local_14,0,0,0,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&pNStack_10->super_CallLogWrapper,0x8c1a,0,0x9278,0,0,local_14,0,0,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&pNStack_10->super_CallLogWrapper,0x8c1a,0,0x9278,local_14,local_14,local_14,0,0,
             (void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void compressedteximage3d_max_width_height_depth (NegativeTestContext& ctx)
{
	int maxTextureSize = ctx.getInteger(GL_MAX_TEXTURE_SIZE) + 1;

	ctx.beginSection("GL_INVALID_VALUE is generated if width, height or depth is greater than GL_MAX_TEXTURE_SIZE.");
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, maxTextureSize, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, maxTextureSize, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0, maxTextureSize, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, maxTextureSize, maxTextureSize, maxTextureSize, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}